

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O1

void __thiscall
AutoArgParse::UnexpectedArgException::UnexpectedArgException
          (UnexpectedArgException *this,string *unexpectedArg,FlagStore *flagStore)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  string local_40;
  
  makeErrorMessage(&local_40,unexpectedArg,flagStore);
  ParseException::ParseException(&this->super_ParseException,UNEXPECTED_ARG,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_ParseException = &PTR__UnexpectedArgException_00111a60;
  paVar1 = &(this->unexpectedArg).field_2;
  (this->unexpectedArg)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (unexpectedArg->_M_dataplus)._M_p;
  paVar2 = &unexpectedArg->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&unexpectedArg->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->unexpectedArg).field_2 + 8) = uVar4;
  }
  else {
    (this->unexpectedArg)._M_dataplus._M_p = pcVar3;
    (this->unexpectedArg).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->unexpectedArg)._M_string_length = unexpectedArg->_M_string_length;
  (unexpectedArg->_M_dataplus)._M_p = (pointer)paVar2;
  unexpectedArg->_M_string_length = 0;
  (unexpectedArg->field_2)._M_local_buf[0] = '\0';
  this->flagStore = flagStore;
  return;
}

Assistant:

UnexpectedArgException(std::string unexpectedArg,
                           const FlagStore& flagStore)
        : ParseException(UNEXPECTED_ARG,
                         makeErrorMessage(unexpectedArg, flagStore)),
          unexpectedArg(std::move(unexpectedArg)),
          flagStore(flagStore) {}